

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::Subst_LForward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  long lVar3;
  long lVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_a0;
  Fad<double> sum;
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar4 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar4 != CONCAT44(extraout_var,iVar1)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LForward incompatible dimensions\n",(char *)0x0);
  }
  lVar4 = 0;
  while( true ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
    if (CONCAT44(extraout_var_00,iVar1) <= lVar4) break;
    for (lVar2 = 0; lVar2 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
        lVar2 = lVar2 + 1) {
      sum.val_ = 0.0;
      sum.dx_.num_elts = 0;
      sum.dx_.ptr_to_data = (double *)0x0;
      sum.defaultVal = 0.0;
      for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar4,lVar3);
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(&local_70,B,lVar3,lVar2);
        local_a0.fadexpr_.left_ = &local_50;
        local_a0.fadexpr_.right_ = &local_70;
        Fad<double>::operator+=(&sum,&local_a0);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad(&local_50);
      }
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(&local_70,B,lVar4,lVar2);
      local_a0.fadexpr_.right_ = &sum;
      local_a0.fadexpr_.left_ = &local_70;
      Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                (&local_50,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&local_a0);
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(B,lVar4,lVar2,&local_50);
      Fad<double>::~Fad(&local_50);
      Fad<double>::~Fad(&local_70);
      Fad<double>::~Fad(&sum);
    }
    lVar4 = lVar4 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}